

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceSelector.hpp
# Opt level: O0

void __thiscall
AO::BehaviorTree::Version_1::Details::SequenceSelector<Agent,_short>::initialize
          (SequenceSelector<Agent,_short> *this,EntityPtr entity)

{
  bool bVar1;
  ChildrenList *this_00;
  __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  element_type *peVar2;
  shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_> *child;
  iterator __end0;
  iterator __begin0;
  ChildrenList *__range4;
  EntityPtr entity_local;
  SequenceSelector<Agent,_short> *this_local;
  
  this->currentPosition = 0xffffffffffffffff;
  this_00 = &(this->super_CompositeNode<Agent,_short>).children;
  __end0 = std::
           vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
           ::begin(this_00);
  child = (shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_> *)
          std::
          vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_*,_std::vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>_>
                                *)&child);
    if (!bVar1) break;
    this_01 = (__shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_*,_std::vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>_>
                 ::operator*(&__end0);
    peVar2 = std::
             __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    (*(peVar2->super_RootNode<Agent,_short>)._vptr_RootNode[2])(peVar2,entity);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_*,_std::vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void initialize(EntityPtr entity) override final
					{
						currentPosition = InitialPosition;
						for (auto &child : this->children)
						{
							child->initialize(entity);
						}
					}